

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramExecutor.cpp
# Opt level: O3

void rsg::interpolateFragmentInput<64>
               (StridedValueAccess<64> dst,int dstComp,ConstValueAccess vtx0,ConstValueAccess vtx1,
               ConstValueAccess vtx2,ConstValueAccess vtx3,float x,float y)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  TestError *this;
  VariableType *this_00;
  int iVar5;
  long lVar6;
  float local_88;
  
  this_00 = dst.super_ConstStridedValueAccess<64>.m_type;
  if (this_00->m_baseType == TYPE_FLOAT) {
    iVar4 = this_00->m_numElements;
    if (0 < (long)iVar4) {
      iVar5 = 0;
      lVar6 = 0;
      do {
        VariableType::getElementType(vtx0.m_type);
        fVar1 = vtx0.m_value[lVar6].floatVal;
        VariableType::getElementType(vtx1.m_type);
        fVar2 = vtx1.m_value[lVar6].floatVal;
        VariableType::getElementType(vtx2.m_type);
        fVar3 = vtx2.m_value[lVar6].floatVal;
        VariableType::getElementType(vtx3.m_type);
        if (1.0 <= x + y) {
          fVar1 = vtx3.m_value[lVar6].floatVal;
          local_88 = (fVar3 - fVar1) * (1.0 - x) + fVar1 + (fVar2 - fVar1) * (1.0 - y);
        }
        else {
          local_88 = (fVar3 - fVar1) * y + (fVar2 - fVar1) * x + fVar1;
        }
        VariableType::getElementType(this_00);
        dst.super_ConstStridedValueAccess<64>.m_value[(long)dstComp + (long)iVar5].floatVal =
             local_88;
        lVar6 = lVar6 + 1;
        iVar5 = iVar5 + 0x40;
      } while (iVar4 != lVar6);
    }
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"dst.getType().getBaseType() == VariableType::TYPE_FLOAT",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgProgramExecutor.cpp"
             ,0x99);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void interpolateFragmentInput (StridedValueAccess<Stride> dst, int dstComp, ConstValueAccess vtx0, ConstValueAccess vtx1, ConstValueAccess vtx2, ConstValueAccess vtx3, float x, float y)
{
	TCU_CHECK(dst.getType().getBaseType() == VariableType::TYPE_FLOAT);
	int numElements = dst.getType().getNumElements();
	for (int ndx = 0; ndx < numElements; ndx++)
		dst.component(ndx).asFloat(dstComp) = interpolateFragment(tcu::Vec4(vtx0.component(ndx).asFloat(), vtx1.component(ndx).asFloat(), vtx2.component(ndx).asFloat(), vtx3.component(ndx).asFloat()), x, y);
}